

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

Fad<float> * __thiscall
TPZFMatrix<Fad<float>_>::GetVal
          (Fad<float> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,int64_t row,int64_t col)

{
  Fad<float>::Fad(__return_storage_ptr__,
                  this->fElem +
                  col * (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow + row);
  return __return_storage_ptr__;
}

Assistant:

inline const TVar TPZFMatrix<TVar>::GetVal( const int64_t row, const int64_t col ) const {
    return( fElem[ col*this->fRow + row ] );
}